

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValueAndRemove
          (BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uint *key,InstrByteCodeRegisterUses *value)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses> *pKVar2;
  undefined6 uVar3;
  bool bVar4;
  int local_2c;
  int local_28;
  int i;
  int last;
  uint targetBucket;
  
  bVar4 = FindEntryWithKey<unsigned_int>(this,key,&local_2c,&local_28,(uint *)&i);
  if (bVar4) {
    pKVar2 = &this->entries[local_2c].
              super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>;
    uVar3 = *(undefined6 *)
             &(pKVar2->
              super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
              ).super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.value.
              field_0x2;
    pBVar1 = this->entries[local_2c].
             super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
             super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
             .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.value.bv
    ;
    value->capturingOpCode =
         (pKVar2->
         super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
         ).super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.value.
         capturingOpCode;
    *(undefined6 *)&value->field_0x2 = uVar3;
    value->bv = pBVar1;
    RemoveAt(this,local_2c,local_28,i);
  }
  return bVar4;
}

Assistant:

bool TryGetValueAndRemove(const TKey& key, TValue* value)
        {
            int i, last;
            uint targetBucket;
            if (FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                *value = entries[i].Value();
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }